

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

bool __thiscall
DisasmReplayer::enqueue_create_raytracing_pipeline
          (DisasmReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  pointer *pppVVar1;
  pointer *pppVVar2;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  bool bVar3;
  VkResult VVar4;
  VkRayTracingPipelineCreateInfoKHR *local_38;
  Hash local_30;
  
  local_38 = create_info;
  local_30 = hash;
  bVar3 = raytracing_pipeline_is_active(this,hash);
  if (bVar3) {
    if (this->device == (VulkanDevice *)0x0) {
      *pipeline = (VkPipeline)hash;
    }
    else {
      if (this->device->pipeline_stats == true) {
        *(byte *)&create_info->flags = (byte)create_info->flags | 0xc0;
      }
      fprintf((FILE *)_stderr,"Fossilize INFO: Creating raytracing pipeline %0lX\n",hash);
      fflush((FILE *)_stderr);
      VVar4 = (*vkCreateRayTracingPipelinesKHR)
                        (this->device->device,(VkDeferredOperationKHR)0x0,this->pipeline_cache,1,
                         create_info,(VkAllocationCallbacks *)0x0,pipeline);
      if (VVar4 != VK_SUCCESS) {
        enqueue_create_raytracing_pipeline(_stderr);
        return false;
      }
      enqueue_create_raytracing_pipeline(_stderr);
    }
    __position._M_current =
         (this->raytracing_pipelines).
         super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->raytracing_pipelines).
        super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkPipeline_T*,std::allocator<VkPipeline_T*>>::
      _M_realloc_insert<VkPipeline_T*const&>
                ((vector<VkPipeline_T*,std::allocator<VkPipeline_T*>> *)&this->raytracing_pipelines,
                 __position,pipeline);
    }
    else {
      *__position._M_current = *pipeline;
      pppVVar1 = &(this->raytracing_pipelines).
                  super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
    __position_00._M_current =
         (this->raytracing_infos).
         super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->raytracing_infos).
        super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<VkRayTracingPipelineCreateInfoKHR_const*,std::allocator<VkRayTracingPipelineCreateInfoKHR_const*>>
      ::_M_realloc_insert<VkRayTracingPipelineCreateInfoKHR_const*const&>
                ((vector<VkRayTracingPipelineCreateInfoKHR_const*,std::allocator<VkRayTracingPipelineCreateInfoKHR_const*>>
                  *)&this->raytracing_infos,__position_00,&local_38);
    }
    else {
      *__position_00._M_current = create_info;
      pppVVar2 = &(this->raytracing_infos).
                  super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppVVar2 = *pppVVar2 + 1;
    }
    __position_01._M_current =
         (this->raytracing_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_01._M_current ==
        (this->raytracing_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->raytracing_hashes,
                 __position_01,&local_30);
    }
    else {
      *__position_01._M_current = hash;
      (this->raytracing_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position_01._M_current + 1;
    }
  }
  else {
    *pipeline = (VkPipeline)hash;
  }
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		if (!raytracing_pipeline_is_active(hash))
		{
			*pipeline = fake_handle<VkPipeline>(hash);
			return true;
		}

		if (device)
		{
			if (device->has_pipeline_stats())
			{
				const_cast<VkRayTracingPipelineCreateInfoKHR *>(create_info)->flags |=
						VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR | VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR;
			}

			LOGI("Creating raytracing pipeline %0" PRIX64 "\n", hash);
			if (vkCreateRayTracingPipelinesKHR(device->get_device(), VK_NULL_HANDLE, pipeline_cache,
			                                   1, create_info, nullptr, pipeline) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*pipeline = fake_handle<VkPipeline>(hash);

		raytracing_pipelines.push_back(*pipeline);
		raytracing_infos.push_back(create_info);
		raytracing_hashes.push_back(hash);
		return true;
	}